

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2051f::QSBR_SingleThreadAllocationAndEpochChange_Test::TestBody
          (QSBR_SingleThreadAllocationAndEpochChange_Test *this)

{
  char *pcVar1;
  
  pcVar1 = (char *)unodb::test::QSBRTestBase::allocate();
  *pcVar1 = unodb::test::QSBRTestBase::touch_memory(char*,char)::value;
  unodb::test::QSBRTestBase::touch_memory(char*,char)::value =
       unodb::test::QSBRTestBase::touch_memory(char*,char)::value + '\x01';
  unodb::test::QSBRTestBase::qsbr_deallocate(pcVar1);
  unodb::test::QSBRTestBase::mark_epoch(&this->super_QSBR);
  unodb::test::QSBRTestBase::quiescent();
  unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  pcVar1 = (char *)unodb::test::QSBRTestBase::allocate();
  *pcVar1 = unodb::test::QSBRTestBase::touch_memory(char*,char)::value;
  unodb::test::QSBRTestBase::touch_memory(char*,char)::value =
       unodb::test::QSBRTestBase::touch_memory(char*,char)::value + '\x01';
  unodb::test::QSBRTestBase::qsbr_deallocate(pcVar1);
  return;
}

Assistant:

UNODB_TEST_F(QSBR, SingleThreadAllocationAndEpochChange) {
  auto *ptr = static_cast<char *>(allocate());
  touch_memory(ptr);
  qsbr_deallocate(ptr);

  mark_epoch();

  quiescent();

  check_epoch_advanced();

  ptr = static_cast<char *>(allocate());
  touch_memory(ptr);
  qsbr_deallocate(ptr);
}